

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5PreciseQualifier.cpp
# Opt level: O1

void __thiscall glcts::GPUShader5PreciseQualifier::initTest(GPUShader5PreciseQualifier *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  char *in_RAX;
  undefined4 extraout_var;
  TestError *this_00;
  pointer_____offset_0x10___ *ppuVar6;
  char *feedback_varyings [1];
  long lVar5;
  
  if ((this->super_TestCaseBase).m_is_gpu_shader5_supported == false) {
    feedback_varyings[0] = in_RAX;
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"GPU shader5 functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
               ,0x79);
    ppuVar6 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar5 = CONCAT44(extraout_var,iVar2);
    GVar3 = (**(code **)(lVar5 + 0x3c8))();
    this->m_program_id = GVar3;
    feedback_varyings[0] = "weightedSum";
    (**(code **)(lVar5 + 0x14c8))(GVar3,1,feedback_varyings,0x8c8c);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not set transform feedback varyings!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                    ,0x85);
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
    this->m_vertex_shader_id = GVar3;
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
    this->m_fragment_shader_id = GVar3;
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_program_id,GVar3,1,&m_fragment_shader_code,
                       this->m_vertex_shader_id,1,&m_vertex_shader_code,(bool *)0x0);
    if (bVar1) {
      (**(code **)(lVar5 + 0x708))(1,&this->m_vao_id);
      (**(code **)(lVar5 + 0xd8))(this->m_vao_id);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Could not create a vertex array object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                      ,0x96);
      (**(code **)(lVar5 + 0x6c8))(1,&this->m_tf_buffer_id);
      (**(code **)(lVar5 + 0x40))(0x8892,this->m_tf_buffer_id);
      (**(code **)(lVar5 + 0x150))(0x8892,0x10,0,0x88e6);
      (**(code **)(lVar5 + 0x40))(0x8892,0);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Could not create buffer object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                      ,0x9e);
      (**(code **)(lVar5 + 0x48))(0x8c8e,0,this->m_tf_buffer_id);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Could not bind buffer object to transform feedback binding point!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                      ,0xa3);
      (**(code **)(lVar5 + 0x6c8))(1,&this->m_vertex_positions_buffer_id);
      (**(code **)(lVar5 + 0x40))(0x8892,this->m_vertex_positions_buffer_id);
      (**(code **)(lVar5 + 0x150))(0x8892,0x10,0,0x88e4);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Could not create buffer object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                      ,0xaa);
      (**(code **)(lVar5 + 0x6c8))(1,&this->m_vertex_weights_buffer_id);
      (**(code **)(lVar5 + 0x40))(0x8892,this->m_vertex_weights_buffer_id);
      (**(code **)(lVar5 + 0x150))(0x8892,0x10,0,0x88e4);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Could not create buffer object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                      ,0xb1);
      (**(code **)(lVar5 + 0x1680))(this->m_program_id);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Could not use a program object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                      ,0xb4);
      (**(code **)(lVar5 + 0x40))(0x8892,this->m_vertex_positions_buffer_id);
      (**(code **)(lVar5 + 0x19f0))(0,4,0x1406,0,0,0);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Could not configure vertex attribute array for positions attribute!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                      ,0xb8);
      (**(code **)(lVar5 + 0x40))(0x8892,this->m_vertex_weights_buffer_id);
      (**(code **)(lVar5 + 0x19f0))(1,4,0x1406,0,0,0);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Could not configure vertex attribute array for weights attribute!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                      ,0xbc);
      (**(code **)(lVar5 + 0x610))(0);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Could not enable vertex attribute array for index 0!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                      ,0xbf);
      (**(code **)(lVar5 + 0x610))(1);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Could not enable vertex attribute array for index 1!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                      ,0xc1);
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,
               "Program could not have been created sucessfully from a valid vertex/geometry/fragment shader!"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
               ,0x8f);
    ppuVar6 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar6,tcu::Exception::~Exception);
}

Assistant:

void GPUShader5PreciseQualifier::initTest(void)
{
	/* Check if gpu_shader5 extension is supported */
	if (!m_is_gpu_shader5_supported)
	{
		throw tcu::NotSupportedError(GPU_SHADER5_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create program object */
	m_program_id = gl.createProgram();

	/* Setup transform feedback varyings */
	const char* feedback_varyings[] = { "weightedSum" };

	gl.transformFeedbackVaryings(m_program_id, 1, feedback_varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set transform feedback varyings!");

	/* Create shaders */
	m_vertex_shader_id   = gl.createShader(GL_VERTEX_SHADER);
	m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);

	/* Build program */
	if (!buildProgram(m_program_id, m_fragment_shader_id, 1, &m_fragment_shader_code, m_vertex_shader_id, 1,
					  &m_vertex_shader_code))
	{
		TCU_FAIL("Program could not have been created sucessfully from a valid vertex/geometry/fragment shader!");
	}

	/* Generate & bind a VAO */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a vertex array object!");

	/* Create transform feedback buffer object */
	gl.genBuffers(1, &m_tf_buffer_id);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_tf_buffer_id);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(glw::GLfloat) * m_n_components, DE_NULL, GL_STATIC_COPY);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create buffer object!");

	/* Bind buffer object to transform feedback binding point */
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_tf_buffer_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object to transform feedback binding point!");

	/* Create positions buffer object */
	gl.genBuffers(1, &m_vertex_positions_buffer_id);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_vertex_positions_buffer_id);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(glw::GLfloat) * m_n_components, DE_NULL, GL_STATIC_DRAW);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create buffer object!");

	/* Create weights buffer object */
	gl.genBuffers(1, &m_vertex_weights_buffer_id);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_vertex_weights_buffer_id);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(glw::GLfloat) * m_n_components, DE_NULL, GL_STATIC_DRAW);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create buffer object!");

	gl.useProgram(m_program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not use a program object!");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_vertex_positions_buffer_id);
	gl.vertexAttribPointer(0 /* index */, 4 /* size */, GL_FLOAT, GL_FALSE, 0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not configure vertex attribute array for positions attribute!");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_vertex_weights_buffer_id);
	gl.vertexAttribPointer(1 /* index */, 4 /* size */, GL_FLOAT, GL_FALSE, 0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not configure vertex attribute array for weights attribute!");

	gl.enableVertexAttribArray(0 /* index */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not enable vertex attribute array for index 0!");
	gl.enableVertexAttribArray(1 /* index */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not enable vertex attribute array for index 1!");
}